

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O0

void Helpers::WriteOutputPNG
               (string *path,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,uint width,
               uint bufferHeight,double gamma,double colorScale)

{
  uchar uVar1;
  png_infop ppVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  uchar *puVar6;
  reference ppuVar7;
  ulong uVar8;
  size_type sVar9;
  const_reference pvVar10;
  uint *puVar11;
  double *pdVar12;
  reference pvVar13;
  char *path_00;
  ostream *this;
  __jmp_buf_tag *__env;
  FILE *pFVar14;
  uchar **ppuVar15;
  uint uVar16;
  double dVar17;
  long local_c8;
  png_infop info_ptr;
  png_structp png_ptr;
  ScopedCFileDescriptor local_b0;
  ScopedCFileDescriptor fd;
  uint j;
  uint i_3;
  double local_98;
  uint local_8c;
  uint local_88;
  uint i_2;
  uint i_1;
  uint32_t maxValue;
  uint i;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pngData;
  double colorScale_local;
  double gamma_local;
  uint bufferHeight_local;
  uint width_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *data_local;
  string *path_local;
  
  pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)colorScale;
  std::allocator<unsigned_char>::allocator(&local_49);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (ulong)(width * bufferHeight * 6),&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  std::allocator<unsigned_char_*>::allocator((allocator<unsigned_char_*> *)((long)&maxValue + 3));
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i,
             (ulong)(bufferHeight * 2),(allocator<unsigned_char_*> *)((long)&maxValue + 3));
  std::allocator<unsigned_char_*>::~allocator((allocator<unsigned_char_*> *)((long)&maxValue + 3));
  for (i_1 = 0; i_1 < bufferHeight << 1; i_1 = i_1 + 1) {
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    uVar16 = width * 3 * i_1;
    ppuVar7 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i,(ulong)i_1)
    ;
    *ppuVar7 = puVar6 + uVar16;
  }
  i_2 = 1;
  local_88 = 0;
  while( true ) {
    uVar8 = (ulong)local_88;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(data);
    if (sVar9 <= uVar8) break;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (data,(ulong)local_88);
    puVar11 = std::max<unsigned_int>(&i_2,pvVar10);
    i_2 = *puVar11;
    local_88 = local_88 + 1;
  }
  local_8c = 0;
  while( true ) {
    uVar8 = (ulong)local_8c;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(data);
    puVar3 = pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (sVar9 <= uVar8) break;
    if ((0.0001 < ABS(gamma - 1.0)) ||
       (0.0001 < ABS((double)pngData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage - 1.0))) {
      local_98 = 1.0;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (data,(ulong)local_8c);
      _j = ((double)puVar3 * (double)*pvVar10) / (double)i_2;
      pdVar12 = std::min<double>(&local_98,(double *)&j);
      dVar17 = pow(*pdVar12,gamma);
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(data);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                           sVar9 + local_8c);
      *pvVar13 = (value_type)(int)(dVar17 * 255.0);
    }
    else {
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (data,(ulong)local_8c);
      uVar16 = (*pvVar10 * 0xff + (i_2 >> 1)) / i_2;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(data);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                           sVar9 + local_8c);
      *pvVar13 = (value_type)uVar16;
    }
    local_8c = local_8c + 1;
  }
  for (fd.Descriptor._4_4_ = 0; fd.Descriptor._4_4_ < bufferHeight;
      fd.Descriptor._4_4_ = fd.Descriptor._4_4_ + 1) {
    for (fd.Descriptor._0_4_ = 0; (uint)fd.Descriptor < width * 3;
        fd.Descriptor._0_4_ = (uint)fd.Descriptor + 1) {
      ppuVar7 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i,
                           (ulong)((bufferHeight * 2 - fd.Descriptor._4_4_) - 1));
      uVar1 = (*ppuVar7)[(uint)fd.Descriptor];
      ppuVar7 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i,
                           (ulong)fd.Descriptor._4_4_);
      (*ppuVar7)[(uint)fd.Descriptor] = uVar1;
    }
  }
  path_00 = (char *)std::__cxx11::string::c_str();
  ScopedCFileDescriptor::ScopedCFileDescriptor(&local_b0,path_00,"wb");
  bVar4 = ScopedCFileDescriptor::IsValid(&local_b0);
  if (bVar4) {
    info_ptr = (png_infop)png_create_write_struct("1.6.37",0,0);
    if (info_ptr == (png_infop)0x0) {
      png_ptr._4_4_ = 1;
    }
    else {
      local_c8 = png_create_info_struct(info_ptr);
      if (local_c8 == 0) {
        png_destroy_write_struct(&info_ptr,0);
        png_ptr._4_4_ = 1;
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(info_ptr,longjmp,200);
        iVar5 = _setjmp(__env);
        ppVar2 = info_ptr;
        if (iVar5 == 0) {
          pFVar14 = ScopedCFileDescriptor::Get(&local_b0);
          png_init_io(ppVar2,pFVar14);
          png_set_IHDR(info_ptr,local_c8,width,bufferHeight * 2,8,2,0,0,0);
          png_write_info(info_ptr,local_c8);
          ppVar2 = info_ptr;
          ppuVar15 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::data
                               ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i);
          png_write_image(ppVar2,ppuVar15);
          png_write_end(info_ptr,local_c8);
          png_destroy_write_struct(&info_ptr,&local_c8);
          png_ptr._4_4_ = 0;
        }
        else {
          png_destroy_write_struct(&info_ptr,&local_c8);
          png_ptr._4_4_ = 1;
        }
      }
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Failed to open image.png for writing.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    png_ptr._4_4_ = 1;
  }
  ScopedCFileDescriptor::~ScopedCFileDescriptor(&local_b0);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
            ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&i);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void WriteOutputPNG(const std::string &path, const std::vector<uint32_t>& data, unsigned int width, unsigned int bufferHeight, double gamma, double colorScale)
    {
        std::vector<png_byte> pngData(3*width*2*bufferHeight);
        std::vector<png_byte *> rows{2*bufferHeight};
        for(unsigned int i = 0; i < 2*bufferHeight ; ++i)
        {
            rows[i] = pngData.data()+3*width*i;
        }

        uint32_t maxValue{UINT32_C(1)};
        for(unsigned int i = 0; i < data.size();++i)
        {
            maxValue = std::max(maxValue,data[i]);
        }
        for(unsigned int i = 0; i < data.size();++i)
        {
            if(fabs(gamma - 1.0) > 0.0001 || fabs(colorScale - 1.0) > 0.0001)
            {
                pngData[data.size() + i] = static_cast<png_byte>(255.0 * pow(std::min(1.0,colorScale*static_cast<double>(data[i])/static_cast<double>(maxValue)),gamma));
            }
            else
            {
                pngData[data.size() + i] = (255*data[i] + (maxValue/2))/maxValue;
            }
        }
        for(unsigned int i = 0; i < bufferHeight;++i)
        {
            for(unsigned int j = 0; j < width*3;++j)
            {
                rows[i][j] =rows[2*bufferHeight-i-1][j];
            }
        }

        ScopedCFileDescriptor fd(path.c_str(), "wb");
        if(!fd.IsValid())
        {
            std::cerr << "Failed to open image.png for writing." << std::endl;
            return;
        }
        png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
        if(!png_ptr)
        {
            return;
        }
        png_infop info_ptr = png_create_info_struct(png_ptr);
        if(!info_ptr)
        {
            png_destroy_write_struct(&png_ptr, (png_infopp)NULL);
            return;
        }
        if(setjmp(png_jmpbuf(png_ptr)))
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            return;
        }
        png_init_io(png_ptr, fd.Get());
        png_set_IHDR(png_ptr, info_ptr, width, 2*bufferHeight, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

        png_write_info(png_ptr, info_ptr);
        //header written.

        png_write_image(png_ptr, rows.data());

        png_write_end(png_ptr, info_ptr);
        png_destroy_write_struct(&png_ptr, &info_ptr);
    }